

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O2

sexp_conflict sexp_gc_op(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n)

{
  sexp_conflict psVar1;
  size_t sum_freed;
  undefined8 local_18;
  
  local_18 = 0;
  sexp_gc(ctx,&local_18);
  psVar1 = (sexp_conflict)sexp_make_unsigned_integer(ctx,local_18,0);
  return psVar1;
}

Assistant:

sexp sexp_gc_op (sexp ctx, sexp self, sexp_sint_t n) {
  size_t sum_freed=0;
#if SEXP_USE_BOEHM
  GC_gcollect();
#else
  sexp_gc(ctx, &sum_freed);
#endif
  return sexp_make_unsigned_integer(ctx, sum_freed);
}